

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VecAttributesImpl.cpp
# Opt level: O2

bool __thiscall
xercesc_4_0::VecAttributesImpl::getIndex
          (VecAttributesImpl *this,XMLCh *uri,XMLCh *localPart,XMLSize_t *index)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  XMLAttr *pXVar4;
  ulong getAt;
  XMLBuffer uriBuffer;
  XMLBuffer local_68;
  
  local_68.fMemoryManager =
       (this->fVector->super_BaseRefVectorOf<xercesc_4_0::XMLAttr>).fMemoryManager;
  local_68.fIndex = 0;
  local_68.fCapacity = 0x3ff;
  local_68.fFullSize = 0;
  local_68.fUsed = false;
  local_68.fFullHandler = (XMLBufferFullHandler *)0x0;
  iVar3 = (*(local_68.fMemoryManager)->_vptr_MemoryManager[3])(local_68.fMemoryManager,0x800);
  local_68.fBuffer = (XMLCh *)CONCAT44(extraout_var,iVar3);
  *local_68.fBuffer = L'\0';
  getAt = 0;
  while( true ) {
    *index = getAt;
    uVar1 = this->fCount;
    if (uVar1 <= getAt) break;
    pXVar4 = BaseRefVectorOf<xercesc_4_0::XMLAttr>::elementAt
                       (&this->fVector->super_BaseRefVectorOf<xercesc_4_0::XMLAttr>,getAt);
    XMLScanner::getURIText(this->fScanner,pXVar4->fAttName->fURIId,&local_68);
    bVar2 = XMLString::equals(pXVar4->fAttName->fLocalPart,localPart);
    if (bVar2) {
      local_68.fBuffer[local_68.fIndex] = L'\0';
      bVar2 = XMLString::equals(local_68.fBuffer,uri);
      if (bVar2) break;
    }
    getAt = *index + 1;
  }
  XMLBuffer::~XMLBuffer(&local_68);
  return getAt < uVar1;
}

Assistant:

bool VecAttributesImpl::getIndex(const XMLCh* const uri,
                                 const XMLCh* const localPart,
                                 XMLSize_t& index) const
{
  //
  //  Search the vector for the attribute with the given name and return
  //  its type.
  //
  XMLBuffer uriBuffer(1023, fVector->getMemoryManager()) ;
  for (index = 0; index < fCount; index++)
  {
    const XMLAttr* curElem = fVector->elementAt(index);

    fScanner->getURIText(curElem->getURIId(), uriBuffer) ;

    if ( (XMLString::equals(curElem->getName(), localPart)) &&
         (XMLString::equals(uriBuffer.getRawBuffer(), uri)) )
      return true;
  }
  return false;
}